

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O1

void __thiscall
Assimp::MD5Importer::AttachChilds_Anim
          (MD5Importer *this,int iParentID,aiNode *piParent,AnimBoneList *bones,
          aiNodeAnim **node_anims)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  uint uVar11;
  aiNodeAnim *paVar12;
  aiVectorKey *paVar13;
  aiQuatKey *paVar14;
  int iVar15;
  aiNode **ppaVar16;
  pointer pAVar17;
  aiNode *this_00;
  long lVar18;
  ulong uVar19;
  char *__dest;
  ulong __n;
  aiNodeAnim **ppaVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 local_430 [1024];
  
  if ((piParent == (aiNode *)0x0) || (piParent->mNumChildren != 0)) {
    __assert_fail("__null != piParent && !piParent->mNumChildren",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MD5/MD5Loader.cpp"
                  ,0x13e,
                  "void Assimp::MD5Importer::AttachChilds_Anim(int, aiNode *, AnimBoneList &, const aiNodeAnim **)"
                 );
  }
  pAVar17 = (bones->
            super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(bones->
                              super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar17) >> 4) *
          -0x3f03f03f) {
    lVar18 = 0x404;
    uVar19 = 0;
    do {
      if (((uint)iParentID != uVar19) &&
         (*(int *)((long)(pAVar17->super_BaseJointDescription).mName.data +
                  lVar18 + 0xfffffffffffffffcU) == iParentID)) {
        piParent->mNumChildren = piParent->mNumChildren + 1;
      }
      uVar19 = uVar19 + 1;
      pAVar17 = (bones->
                super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar18 = lVar18 + 0x410;
    } while ((long)uVar19 <
             (long)((int)((ulong)((long)(bones->
                                        super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar17)
                         >> 4) * -0x3f03f03f));
  }
  if ((ulong)piParent->mNumChildren != 0) {
    ppaVar16 = (aiNode **)operator_new__((ulong)piParent->mNumChildren << 3);
    piParent->mChildren = ppaVar16;
    pAVar17 = (bones->
              super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(bones->
                                super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar17) >> 4) *
            -0x3f03f03f) {
      uVar19 = 0;
LAB_0047cfc6:
      if ((uVar19 != (uint)iParentID) &&
         (pAVar17[uVar19].super_BaseJointDescription.mParentIndex == iParentID)) {
        this_00 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(this_00);
        ppaVar16 = piParent->mChildren;
        piParent->mChildren = ppaVar16 + 1;
        *ppaVar16 = this_00;
        pAVar17 = (bones->
                  super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar19;
        uVar10 = (pAVar17->super_BaseJointDescription).mName.length;
        if (0x3fe < uVar10) {
          uVar10 = 0x3ff;
        }
        __n = (ulong)uVar10;
        memcpy(local_430,(pAVar17->super_BaseJointDescription).mName.data,__n);
        local_430[__n] = 0;
        (this_00->mName).length = uVar10;
        __dest = (this_00->mName).data;
        memcpy(__dest,local_430,__n);
        (this_00->mName).data[__n] = '\0';
        this_00->mParent = piParent;
        ppaVar20 = node_anims;
        do {
          paVar12 = *ppaVar20;
          uVar11 = (paVar12->mNodeName).length;
          if (uVar11 == uVar10) {
            iVar15 = bcmp((paVar12->mNodeName).data,__dest,(ulong)uVar11);
            if (iVar15 == 0) goto LAB_0047d08d;
          }
          ppaVar20 = ppaVar20 + 1;
        } while( true );
      }
      goto LAB_0047d51c;
    }
LAB_0047d53f:
    piParent->mChildren = piParent->mChildren + -(ulong)piParent->mNumChildren;
  }
  return;
LAB_0047d08d:
  paVar13 = paVar12->mPositionKeys;
  (this_00->mTransformation).a1 = 1.0;
  (this_00->mTransformation).a2 = 0.0;
  (this_00->mTransformation).a3 = 0.0;
  (this_00->mTransformation).a4 = 0.0;
  (this_00->mTransformation).b1 = 0.0;
  (this_00->mTransformation).b2 = 1.0;
  (this_00->mTransformation).b3 = 0.0;
  (this_00->mTransformation).b4 = 0.0;
  (this_00->mTransformation).c1 = 0.0;
  (this_00->mTransformation).c2 = 0.0;
  (this_00->mTransformation).c3 = 1.0;
  (this_00->mTransformation).c4 = 0.0;
  (this_00->mTransformation).d1 = 0.0;
  (this_00->mTransformation).d2 = 0.0;
  (this_00->mTransformation).d3 = 0.0;
  (this_00->mTransformation).d4 = 1.0;
  fVar1 = (paVar13->mValue).x;
  (this_00->mTransformation).a4 = fVar1;
  fVar2 = (paVar13->mValue).y;
  (this_00->mTransformation).b4 = fVar2;
  fVar3 = (paVar13->mValue).z;
  (this_00->mTransformation).c4 = fVar3;
  paVar14 = paVar12->mRotationKeys;
  fVar29 = (paVar14->mValue).y;
  fVar4 = (paVar14->mValue).z;
  fVar5 = (paVar14->mValue).x;
  fVar25 = fVar29 * fVar29 + fVar4 * fVar4;
  fVar32 = 1.0 - (fVar25 + fVar25);
  fVar25 = (paVar14->mValue).w;
  fVar30 = fVar5 * fVar29 - fVar4 * fVar25;
  fVar30 = fVar30 + fVar30;
  fVar31 = fVar5 * fVar4 + fVar29 * fVar25;
  fVar26 = fVar4 * fVar25 + fVar5 * fVar29;
  fVar26 = fVar26 + fVar26;
  fVar24 = fVar4 * fVar4 + fVar5 * fVar5;
  fVar34 = 1.0 - (fVar24 + fVar24);
  fVar35 = fVar29 * fVar4 - fVar5 * fVar25;
  fVar28 = fVar5 * fVar4 - fVar29 * fVar25;
  fVar28 = fVar28 + fVar28;
  fVar27 = fVar5 * fVar25 + fVar29 * fVar4;
  fVar27 = fVar27 + fVar27;
  fVar29 = fVar5 * fVar5 + fVar29 * fVar29;
  fVar33 = 1.0 - (fVar29 + fVar29);
  fVar29 = (this_00->mTransformation).a2;
  fVar4 = (this_00->mTransformation).a3;
  fVar31 = fVar31 + fVar31;
  fVar35 = fVar35 + fVar35;
  fVar21 = fVar1 * 0.0;
  fVar5 = (this_00->mTransformation).b1;
  fVar25 = (this_00->mTransformation).b3;
  fVar22 = fVar2 * 0.0;
  fVar24 = (this_00->mTransformation).c2;
  fVar6 = (this_00->mTransformation).c1;
  fVar23 = fVar3 * 0.0;
  fVar7 = (this_00->mTransformation).d2;
  fVar8 = (this_00->mTransformation).d1;
  fVar9 = (this_00->mTransformation).d3;
  (this_00->mTransformation).a1 = fVar28 * fVar4 + fVar29 * fVar26 + fVar32 + fVar21;
  (this_00->mTransformation).a2 = fVar27 * fVar4 + fVar29 * fVar34 + fVar30 + fVar21;
  (this_00->mTransformation).a3 = fVar33 * fVar4 + fVar29 * fVar35 + fVar31 + fVar21;
  (this_00->mTransformation).a4 = fVar4 * 0.0 + fVar29 * 0.0 + 0.0 + fVar1;
  (this_00->mTransformation).b1 = fVar28 * fVar25 + fVar32 * fVar5 + fVar26 + fVar22;
  (this_00->mTransformation).b2 = fVar27 * fVar25 + fVar30 * fVar5 + fVar34 + fVar22;
  (this_00->mTransformation).b3 = fVar33 * fVar25 + fVar31 * fVar5 + fVar35 + fVar22;
  (this_00->mTransformation).b4 = fVar25 * 0.0 + fVar5 * 0.0 + 0.0 + fVar2;
  (this_00->mTransformation).c1 = fVar32 * fVar6 + fVar26 * fVar24 + fVar28 + fVar23;
  (this_00->mTransformation).c2 = fVar30 * fVar6 + fVar34 * fVar24 + fVar27 + fVar23;
  (this_00->mTransformation).c3 = fVar31 * fVar6 + fVar35 * fVar24 + fVar33 + fVar23;
  (this_00->mTransformation).c4 = fVar6 * 0.0 + fVar24 * 0.0 + 0.0 + fVar3;
  (this_00->mTransformation).d1 = fVar28 * fVar9 + fVar32 * fVar8 + fVar26 * fVar7 + 0.0;
  (this_00->mTransformation).d2 = fVar27 * fVar9 + fVar30 * fVar8 + fVar34 * fVar7 + 0.0;
  (this_00->mTransformation).d3 = fVar33 * fVar9 + fVar31 * fVar8 + fVar35 * fVar7 + 0.0;
  (this_00->mTransformation).d4 = fVar9 * 0.0 + fVar8 * 0.0 + fVar7 * 0.0 + 1.0;
  AttachChilds_Anim(this,(int)uVar19,this_00,bones,node_anims);
LAB_0047d51c:
  uVar19 = uVar19 + 1;
  pAVar17 = (bones->
            super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((long)((int)((ulong)((long)(bones->
                                 super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar17) >> 4)
            * -0x3f03f03f) <= (long)uVar19) goto LAB_0047d53f;
  goto LAB_0047cfc6;
}

Assistant:

void MD5Importer::AttachChilds_Anim(int iParentID,aiNode* piParent, AnimBoneList& bones,const aiNodeAnim** node_anims)
{
    ai_assert(NULL != piParent && !piParent->mNumChildren);

    // First find out how many children we'll have
    for (int i = 0; i < (int)bones.size();++i)  {
        if (iParentID != i && bones[i].mParentIndex == iParentID)   {
            ++piParent->mNumChildren;
        }
    }
    if (piParent->mNumChildren) {
        piParent->mChildren = new aiNode*[piParent->mNumChildren];
        for (int i = 0; i < (int)bones.size();++i)  {
            // (avoid infinite recursion)
            if (iParentID != i && bones[i].mParentIndex == iParentID)
            {
                aiNode* pc;
                // setup a new node
                *piParent->mChildren++ = pc = new aiNode();
                pc->mName = aiString(bones[i].mName);
                pc->mParent = piParent;

                // get the corresponding animation channel and its first frame
                const aiNodeAnim** cur = node_anims;
                while ((**cur).mNodeName != pc->mName)++cur;

                aiMatrix4x4::Translation((**cur).mPositionKeys[0].mValue,pc->mTransformation);
                pc->mTransformation = pc->mTransformation * aiMatrix4x4((**cur).mRotationKeys[0].mValue.GetMatrix()) ;

                // add children to this node, too
                AttachChilds_Anim( i, pc, bones,node_anims);
            }
        }
        // undo offset computations
        piParent->mChildren -= piParent->mNumChildren;
    }
}